

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O1

_Bool effect_handler_TELEPORT(effect_handler_context_t_conflict *context)

{
  loc_conflict *plVar1;
  int iVar2;
  loc_conflict lVar3;
  uint32_t uVar4;
  bool bVar5;
  bool bVar6;
  player *p;
  int iVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  wchar_t wVar12;
  uint uVar13;
  _Bool _Var7;
  bool bVar8;
  loc_conflict lVar14;
  monster *pmVar15;
  loc lVar16;
  square *psVar17;
  monster_conflict *mon;
  int iVar18;
  int iVar19;
  ulong uVar20;
  loc_conflict p_00;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  int local_74;
  long local_60;
  
  lVar14 = loc(context->x,context->y);
  iVar18 = (context->value).base;
  iVar21 = (context->value).m_bonus;
  uVar13._0_2_ = z_info->dungeon_wid;
  uVar13._2_2_ = z_info->town_hgt;
  uVar22 = (uint)z_info->dungeon_hgt;
  if (z_info->dungeon_hgt < (ushort)(undefined2)uVar13) {
    uVar22 = uVar13;
  }
  iVar2 = context->subtype;
  bVar5 = (context->origin).what != SRC_MONSTER;
  bVar6 = iVar2 != 0;
  pmVar15 = monster_target_monster(context);
  context->ident = true;
  if (player->upkeep->arena_level != false) {
    return true;
  }
  uVar23 = (ulong)lVar14 >> 0x20;
  _Var7 = loc_is_zero(lVar14);
  if (!_Var7) goto LAB_00140a49;
  if (pmVar15 == (monster *)0x0) {
    if (bVar5 || bVar6) {
      lVar16 = cave_find_decoy(cave);
      _Var7 = loc_is_zero((loc_conflict)lVar16);
      if (_Var7 || iVar2 == 0) {
        plVar1 = &player->grid;
        lVar14.y = 0;
        lVar14.x = plVar1->x;
        lVar16.x = plVar1->x;
        lVar16.y = plVar1->y;
        uVar23 = (ulong)(uint)(player->grid).y;
        _Var7 = square_isno_teleport(cave,lVar16);
        if ((!_Var7) || (iVar18 < 0xb && iVar18 != 0)) {
          _Var7 = player_of_has(player,L'\x1d');
          if (!_Var7) {
            _Var7 = flag_has_dbg((player->state).pflags,10,0x37,"player->state.pflags",
                                 "(PF_PHASEWALK)");
            bVar8 = true;
            if (_Var7 && iVar2 != 0) {
              bVar8 = false;
              msg("Teleport resistance!");
            }
            goto LAB_00140e5c;
          }
          equip_learn_flag(player,L'\x1d');
        }
        bVar8 = false;
        msg("Teleportation forbidden!");
      }
      else {
        square_destroy_decoy(cave,lVar16);
        bVar8 = false;
      }
LAB_00140e5c:
      if (!bVar8) {
        return true;
      }
      goto LAB_00140a49;
    }
    if ((context->origin).what != SRC_MONSTER) {
      __assert_fail("context->origin.what == SRC_MONSTER",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/effect-handler-general.c"
                    ,0xa7e,"_Bool effect_handler_TELEPORT(effect_handler_context_t *)");
    }
    pmVar15 = cave_monster(cave,(context->origin).which.grid.x);
  }
  lVar14.y = 0;
  lVar14.x = (pmVar15->grid).x;
  uVar23 = (ulong)(uint)(pmVar15->grid).y;
LAB_00140a49:
  iVar19 = lVar14.x;
  if (iVar21 != 0) {
    iVar9 = (int)uVar23;
    iVar18 = cave->height - iVar9;
    if (iVar18 < iVar9) {
      iVar18 = iVar9;
    }
    iVar9 = cave->width - iVar19;
    if (iVar9 < iVar19) {
      iVar9 = iVar19;
    }
    if (iVar9 < iVar18) {
      iVar9 = iVar18;
    }
    iVar18 = (iVar9 * iVar21) / 100;
  }
  uVar10 = Rand_div(2);
  iVar21 = iVar18 + 3;
  if (-1 < iVar18) {
    iVar21 = iVar18;
  }
  uVar11 = Rand_div(iVar21 >> 2);
  uVar4 = -uVar11;
  if (uVar10 != 0) {
    uVar4 = uVar11;
  }
  uVar20 = (ulong)lVar14 & 0xffffffff;
  if (cave->height < 3) {
    uVar10 = 0;
    p_00.x = 0;
    p_00.y = 0;
  }
  else {
    local_74 = (uVar22 & 0xffff) * 2;
    bVar8 = true;
    p_00.x = 0;
    p_00.y = 0;
    local_60 = 1;
    uVar10 = 0;
    do {
      if (2 < cave->width) {
        uVar24 = 1;
        do {
          lVar16 = (loc)(local_60 << 0x20 | uVar24);
          wVar12 = distance((loc_conflict)lVar16,(loc_conflict)((uVar23 << 0x20) + uVar20));
          iVar19 = wVar12 - (iVar18 + uVar4);
          iVar21 = -iVar19;
          if (0 < iVar19) {
            iVar21 = iVar19;
          }
          if ((wVar12 != L'\0') &&
             (_Var7 = has_teleport_destination_prereqs((chunk *)cave,lVar16,bVar5 || bVar6), _Var7))
          {
            _Var7 = square_isvault(cave,lVar16);
            if (_Var7) {
              if (!bVar8) goto LAB_00140bd5;
            }
            else {
              if (bVar8) {
                uVar22._0_2_ = z_info->dungeon_wid;
                uVar22._2_2_ = z_info->town_hgt;
                uVar13 = (uint)z_info->dungeon_hgt;
                if (z_info->dungeon_hgt < (ushort)(undefined2)uVar22) {
                  uVar13 = uVar22;
                }
                local_74 = (uVar13 & 0xffff) * 2;
              }
              bVar8 = false;
            }
            if (iVar21 <= local_74) {
              lVar14 = (loc_conflict)mem_zalloc(0x10);
              *(int *)lVar14 = (int)uVar24;
              *(int *)((long)lVar14 + 4) = (int)local_60;
              if (iVar21 < local_74) {
                while (p_00 != (loc_conflict)0x0) {
                  lVar3 = *(loc_conflict *)((long)p_00 + 8);
                  mem_free((void *)p_00);
                  p_00 = lVar3;
                }
                uVar10 = 1;
                p_00 = lVar14;
                local_74 = iVar21;
              }
              else {
                *(loc_conflict *)((long)lVar14 + 8) = p_00;
                uVar10 = uVar10 + 1;
                p_00 = lVar14;
              }
            }
          }
LAB_00140bd5:
          uVar24 = uVar24 + 1;
        } while ((long)uVar24 < (long)cave->width + -1);
      }
      local_60 = local_60 + 1;
    } while (local_60 < (long)cave->height + -1);
  }
  if (uVar10 == 0) {
    if (bVar5 || bVar6) {
      msg("Failed to find teleport destination!");
    }
    else {
      mon = (monster_conflict *)cave_monster(cave,(context->origin).which.grid.x);
      _Var7 = square_isseen(cave,mon->grid);
      if (_Var7) {
        add_monster_message(mon,L'2',true);
      }
    }
  }
  else {
    uVar10 = Rand_div(uVar10);
    for (; uVar10 != 0; uVar10 = uVar10 - 1) {
      lVar14 = *(loc_conflict *)((long)p_00 + 8);
      mem_free((void *)p_00);
      p_00 = lVar14;
    }
    bVar8 = !bVar5 && !bVar6;
    if (iVar2 == 0 && (bVar5 || bVar6)) {
      _Var7 = flag_has_dbg((player->state).pflags,10,0x37,"player->state.pflags","(PF_PHASEWALK)");
      p = player;
      iVar18 = 10;
      if (_Var7) {
        wVar12 = distance((loc_conflict)((uVar23 << 0x20) + uVar20),*(loc_conflict *)p_00);
        player_add_speed_boost(p,wVar12 + L'\x14');
      }
    }
    else {
      iVar18 = (uint)bVar8 + (uint)bVar8 * 4 + 10;
    }
    sound(iVar18);
    monster_swap((loc)(uVar20 | uVar23 << 0x20),*(loc *)p_00);
    if (bVar5 || bVar6) {
      player_handle_post_move(player,true,(context->origin).what == SRC_MONSTER);
    }
    psVar17 = square(cave,*(loc *)p_00);
    flag_off(psVar17->info,3,0x12);
    pmVar15 = target_get_monster();
    _Var7 = target_able(pmVar15);
    if (!_Var7) {
      target_set_monster((monster *)0x0);
    }
    handle_stuff(player);
    do {
      lVar14 = *(loc_conflict *)((long)p_00 + 8);
      mem_free((void *)p_00);
      p_00 = lVar14;
    } while (lVar14 != (loc_conflict)0x0);
  }
  return true;
}

Assistant:

bool effect_handler_TELEPORT(effect_handler_context_t *context)
{
	struct loc start = loc(context->x, context->y);
	int dis = context->value.base;
	int perc = context->value.m_bonus;
	int pick;
	struct loc grid;

	struct jumps {
		struct loc grid;
		struct jumps *next;
	} *spots = NULL;
	int num_spots = 0;
	int current_score = 2 * MAX(z_info->dungeon_wid, z_info->dungeon_hgt);
	bool only_vault_grids_possible = true;

	bool hostile = context->subtype ? true : false;
	bool is_player = (context->origin.what != SRC_MONSTER || hostile);
	struct monster *t_mon = monster_target_monster(context);

	context->ident = true;

	/* No teleporting in arena levels */
	if (player->upkeep->arena_level) return true;

	/* Establish the coordinates to teleport from, if we don't know already */
	if (!loc_is_zero(start)) {
		/* We're good */
	} else if (t_mon) {
		/* Monster targeting another monster */
		start = t_mon->grid;
	} else if (is_player) {
		/* Decoys get destroyed */
		struct loc decoy = cave_find_decoy(cave);
		if (!loc_is_zero(decoy) && hostile) {
			square_destroy_decoy(cave, decoy);
			return true;
		}

		start = player->grid;

		/* Check for a no teleport grid */
		if (square_isno_teleport(cave, start) &&
			((dis > 10) || (dis == 0))) {
			msg("Teleportation forbidden!");
			return true;
		}

		/* Check for a no teleport curse */
		if (player_of_has(player, OF_NO_TELEPORT)) {
			equip_learn_flag(player, OF_NO_TELEPORT);
			msg("Teleportation forbidden!");
			return true;
		}

		/* Check for teleport resistance */
		if (player_has(player, PF_PHASEWALK) && hostile) {
			msg("Teleport resistance!");
			return true;
		}
	} else {
		assert(context->origin.what == SRC_MONSTER);
		struct monster *mon = cave_monster(cave, context->origin.which.monster);
		start = mon->grid;
	}

	/* Percentage of the largest cardinal distance to an edge */
	if (perc) {
		int vertical = MAX(start.y, cave->height - start.y);
		int horizontal = MAX(start.x, cave->width - start.x);
		dis = (MAX(vertical, horizontal) * perc) / 100;
	}

	/* Randomise the distance a little */
	if (one_in_(2)) {
		dis -= randint0(dis / 4);
	} else {
		dis += randint0(dis / 4);
	}

	/* Make a list of the best grids, scoring by how good an approximation
	 * the distance from the start is to the distance we want */
	for (grid.y = 1; grid.y < cave->height - 1; grid.y++) {
		for (grid.x = 1; grid.x < cave->width - 1; grid.x++) {
			int d = distance(grid, start);
			int score = ABS(d - dis);
			struct jumps *new;

			/* Must move */
			if (d == 0) continue;

			if (!has_teleport_destination_prereqs(cave, grid,
					is_player)) continue;

			/* No teleporting into vaults and such, unless there's no choice */
			if (square_isvault(cave, grid)) {
				if (!only_vault_grids_possible) {
					continue;
				}
			} else {
				/* Just starting to consider non-vault grids, so reset score */
				if (only_vault_grids_possible) {
					current_score = 2 * MAX(z_info->dungeon_wid,
											z_info->dungeon_hgt);
				}
				only_vault_grids_possible = false;
			}

			/* Do we have better spots already? */
			if (score > current_score) continue;

			/* Make a new spot */
			new = mem_zalloc(sizeof(struct jumps));
			new->grid = grid;

			/* If improving start a new list, otherwise extend the old one */
			if (score < current_score) {
				current_score = score;
				while (spots) {
					struct jumps *next = spots->next;
					mem_free(spots);
					spots = next;
				}
				spots = new;
				num_spots = 1;
			} else {
				new->next = spots;
				spots = new;
				num_spots++;
			}
		}
	}

	/* Report failure (very unlikely) */
	if (!num_spots) {
		if (is_player) {
			msg("Failed to find teleport destination!");
		} else {
			/*
			 * With either teleport self or teleport other, it'll
			 * be the caster that is puzzled.
			 */
			struct monster *mon = cave_monster(cave,
				context->origin.which.monster);

			if (square_isseen(cave, mon->grid)) {
				add_monster_message(mon, MON_MSG_BRIEF_PUZZLE,
					true);
			}
		}
		return true;
	}

	/* Pick a spot */
	pick = randint0(num_spots);
	while (pick) {
		struct jumps *next = spots->next;
		mem_free(spots);
		spots = next;
		pick--;
	}

	/* Check for specialty speed boost on friendly teleports */
	if (is_player && !hostile && player_has(player, PF_PHASEWALK)) {
		player_add_speed_boost(player, 20 + distance(start, spots->grid));
	}

	/* Sound */
	sound(is_player ? MSG_TELEPORT : MSG_TPOTHER);

	/* Move player or monster */
	monster_swap(start, spots->grid);
	if (is_player) {
		player_handle_post_move(player, true,
			context->origin.what == SRC_MONSTER);
	}

	/* Clear any projection marker to prevent double processing */
	sqinfo_off(square(cave, spots->grid)->info, SQUARE_PROJECT);

	/* Clear monster target if it's no longer visible */
	if (!target_able(target_get_monster())) {
		target_set_monster(NULL);
	}

	/* Lots of updates after monster_swap */
	handle_stuff(player);

	while (spots) {
		struct jumps *next = spots->next;
		mem_free(spots);
		spots = next;
	}

	return true;
}